

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

DSPOMDP * __thiscall despot::POMDPX::MakeCopy(POMDPX *this)

{
  double dVar1;
  undefined4 uVar2;
  POMDPX *this_00;
  
  this_00 = (POMDPX *)operator_new(0x118);
  POMDPX(this_00);
  this_00->parser_ = this->parser_;
  this_00->is_small_ = this->is_small_;
  uVar2 = *(undefined4 *)&(this->min_reward_action_).field_0x4;
  dVar1 = (this->min_reward_action_).value;
  (this_00->min_reward_action_).action = (this->min_reward_action_).action;
  *(undefined4 *)&(this_00->min_reward_action_).field_0x4 = uVar2;
  (this_00->min_reward_action_).value = dVar1;
  uVar2 = *(undefined4 *)&(this->max_reward_action_).field_0x4;
  dVar1 = (this->max_reward_action_).value;
  (this_00->max_reward_action_).action = (this->max_reward_action_).action;
  *(undefined4 *)&(this_00->max_reward_action_).field_0x4 = uVar2;
  (this_00->max_reward_action_).value = dVar1;
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::operator=
            (&this_00->states_,&this->states_);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::operator=(&this_00->transition_probabilities_,&this->transition_probabilities_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this_00->rewards_,&this->rewards_);
  std::vector<int,_std::allocator<int>_>::operator=
            (&this_00->default_action_,&this->default_action_);
  return &this_00->super_DSPOMDP;
}

Assistant:

DSPOMDP* POMDPX::MakeCopy() const {
	POMDPX* pomdpx = new POMDPX();

	pomdpx->parser_ = this->parser_;
	pomdpx->is_small_ = this->is_small_;
	pomdpx->min_reward_action_ = this->min_reward_action_;
	pomdpx->max_reward_action_ = this->max_reward_action_;

	pomdpx->states_ = this->states_;
	pomdpx->transition_probabilities_ = this->transition_probabilities_;
	pomdpx->rewards_ = this->rewards_;

	pomdpx->default_action_ = this->default_action_;

	// pomdpx->PrintModel();
	// this->PrintModel();

	return pomdpx;
}